

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O2

void jpeg_finish_compress(j_compress_ptr cinfo)

{
  int iVar1;
  uint uVar2;
  jpeg_progress_mgr *pjVar3;
  boolean bVar4;
  jpeg_error_mgr *pjVar5;
  ulong uVar6;
  
  iVar1 = cinfo->global_state;
  if (iVar1 - 0x65U < 2) {
    if (cinfo->next_scanline < cinfo->image_height) {
      pjVar5 = cinfo->err;
      pjVar5->msg_code = 0x43;
      (*pjVar5->error_exit)((j_common_ptr)cinfo);
    }
    pjVar5 = (jpeg_error_mgr *)&cinfo->master->finish_pass;
  }
  else {
    if (iVar1 == 0x67) goto LAB_0010a3f0;
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x14;
    (pjVar5->msg_parm).i[0] = iVar1;
    pjVar5 = cinfo->err;
  }
  (*pjVar5->error_exit)(cinfo);
LAB_0010a3f0:
  while (cinfo->master->is_last_pass == 0) {
    (*cinfo->master->prepare_for_pass)(cinfo);
    for (uVar6 = 0; uVar2 = cinfo->total_iMCU_rows, uVar6 < uVar2; uVar6 = uVar6 + 1) {
      pjVar3 = cinfo->progress;
      if (pjVar3 != (jpeg_progress_mgr *)0x0) {
        pjVar3->pass_counter = uVar6;
        pjVar3->pass_limit = (ulong)uVar2;
        (*pjVar3->progress_monitor)((j_common_ptr)cinfo);
      }
      bVar4 = (*cinfo->coef->compress_data)(cinfo,(JSAMPIMAGE)0x0);
      if (bVar4 == 0) {
        pjVar5 = cinfo->err;
        pjVar5->msg_code = 0x18;
        (*pjVar5->error_exit)((j_common_ptr)cinfo);
      }
    }
    (*cinfo->master->finish_pass)(cinfo);
  }
  (*cinfo->marker->write_file_trailer)(cinfo);
  (*cinfo->dest->term_destination)(cinfo);
  jpeg_abort((j_common_ptr)cinfo);
  return;
}

Assistant:

GLOBAL(void)
jpeg_finish_compress(j_compress_ptr cinfo)
{
  JDIMENSION iMCU_row;

  if (cinfo->global_state == CSTATE_SCANNING ||
      cinfo->global_state == CSTATE_RAW_OK) {
    /* Terminate first pass */
    if (cinfo->next_scanline < cinfo->image_height)
      ERREXIT(cinfo, JERR_TOO_LITTLE_DATA);
    (*cinfo->master->finish_pass) (cinfo);
  } else if (cinfo->global_state != CSTATE_WRCOEFS)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Perform any remaining passes */
  while (!cinfo->master->is_last_pass) {
    (*cinfo->master->prepare_for_pass) (cinfo);
    for (iMCU_row = 0; iMCU_row < cinfo->total_iMCU_rows; iMCU_row++) {
      if (cinfo->progress != NULL) {
        cinfo->progress->pass_counter = (long)iMCU_row;
        cinfo->progress->pass_limit = (long)cinfo->total_iMCU_rows;
        (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
      }
      /* We bypass the main controller and invoke coef controller directly;
       * all work is being done from the coefficient buffer.
       */
      if (!(*cinfo->coef->compress_data) (cinfo, (JSAMPIMAGE)NULL))
        ERREXIT(cinfo, JERR_CANT_SUSPEND);
    }
    (*cinfo->master->finish_pass) (cinfo);
  }
  /* Write EOI, do final cleanup */
  (*cinfo->marker->write_file_trailer) (cinfo);
  (*cinfo->dest->term_destination) (cinfo);
  /* We can use jpeg_abort to release memory and reset global_state */
  jpeg_abort((j_common_ptr)cinfo);
}